

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  long *plVar2;
  ulong *puVar3;
  TestError *pTVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  string shader_source;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  ExpressionsTypeRestrictions1<glcts::ArraysOfArrays::Interface::GL> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar8 = 0;
  local_58 = this;
  while (supported_variable_types_map._16_8_ != 0) {
    iVar1 = (&opaque_var_types)[lVar8];
    lVar7 = 0x21e5b78;
    lVar5 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar5 + 0x20)) {
        lVar7 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < iVar1) * 8);
    } while (lVar5 != 0);
    if ((lVar7 == 0x21e5b78) || (iVar1 < *(int *)(lVar7 + 0x20))) break;
    std::operator+(&local_50,"uniform ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar7 + 0x48));
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_118 = &local_108;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_108 = *plVar6;
      lStack_100 = plVar2[3];
    }
    else {
      local_108 = *plVar6;
      local_118 = (long *)*plVar2;
    }
    local_110 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_118,*(ulong *)(lVar7 + 0x28));
    local_138 = &local_128;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_128 = *plVar6;
      lStack_120 = plVar2[3];
    }
    else {
      local_128 = *plVar6;
      local_138 = (long *)*plVar2;
    }
    local_130 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_a8 = *plVar6;
      lStack_a0 = plVar2[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar6;
      local_b8 = (long *)*plVar2;
    }
    local_b0 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,*(ulong *)(lVar7 + 0x48));
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar2[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar2;
    }
    local_90 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_68 = *plVar6;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar6;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_78,*(ulong *)(lVar7 + 0x28));
    local_f8 = &local_e8;
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_e8 = *plVar6;
      lStack_e0 = plVar2[3];
    }
    else {
      local_e8 = *plVar6;
      local_f8 = (long *)*plVar2;
    }
    local_f0 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_c8 = *plVar6;
      lStack_c0 = plVar2[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar6;
      local_d8 = (long *)*plVar2;
    }
    local_d0 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_d8,shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_d8);
    puVar3 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_d8);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar3 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_d8,*puVar3);
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xb50);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_d8,shader_end_abi_cxx11_);
    (*(local_58->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[8])(local_58,(ulong)tested_shader_type,&local_d8);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 0xf) {
      return;
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xb57);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsTypeRestrictions1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source =
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " var1[2][2];\n"
																								"uniform " +
				var_iterator->second.precision + " " + var_iterator->second.type + " var2[2][2];\n\n";
			shader_source += shader_start;

			shader_source += "    var1 = var2;\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}